

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3WalCheckpoint
              (Wal *pWal,sqlite3 *db,int eMode,_func_int_void_ptr *xBusy,void *pBusyArg,
              int sync_flags,int nBuf,u8 *zBuf,int *pnLog,int *pnCkpt)

{
  u16 uVar1;
  ushort uVar2;
  uint uVar3;
  uint uVar4;
  sqlite3_io_methods *psVar5;
  sqlite3_file *psVar6;
  int iVar7;
  Wal *pWVar8;
  u32 *puVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  u32 uVar13;
  ht_slot *aTmp;
  undefined4 extraout_var;
  ulong uVar14;
  long lVar15;
  uint uVar16;
  u64 n;
  uint *puVar17;
  uint uVar18;
  uint *puVar19;
  uint uVar20;
  uint uVar21;
  ulong uVar22;
  long lVar23;
  bool bVar24;
  ht_slot *aMerge;
  int nList;
  int isChanged;
  ht_slot *aHash;
  i64 nSize;
  uint *local_1b0;
  uint local_1a8;
  uint local_194;
  Wal *local_190;
  undefined8 local_188;
  undefined8 local_180;
  ht_slot *local_178;
  u32 *local_170;
  ulong local_168;
  ulong local_160;
  _func_int_void_ptr *local_158;
  ulong local_150;
  int local_144;
  ulong local_140;
  uint local_138;
  int local_134;
  uint *local_130;
  void *local_128;
  ulong local_120;
  u32 *local_118;
  sqlite3 *local_110;
  u32 *local_108;
  uint local_100 [52];
  
  local_144 = 0;
  if (pWal->readOnly != '\0') {
    return 8;
  }
  iVar10 = 0;
  if (pWal->exclusiveMode == '\0') {
    iVar10 = (*pWal->pDbFd->pMethods->xShmLock)(pWal->pDbFd,1,1,10);
  }
  if (iVar10 != 0) {
    return iVar10;
  }
  pWal->ckptLock = '\x01';
  local_134 = eMode;
  local_110 = db;
  if (eMode == 0) {
    iVar10 = 0;
    iVar11 = 0;
  }
  else {
    do {
      iVar10 = 0;
      if (pWal->exclusiveMode == '\0') {
        iVar10 = (*pWal->pDbFd->pMethods->xShmLock)(pWal->pDbFd,0,1,10);
      }
    } while (((xBusy != (_func_int_void_ptr *)0x0) && (iVar10 == 5)) &&
            (iVar11 = (*xBusy)(pBusyArg), iVar11 != 0));
    if (iVar10 == 5) {
      iVar10 = 0;
      xBusy = (_func_int_void_ptr *)0x0;
      iVar11 = 0;
    }
    else {
      iVar11 = eMode;
      if (iVar10 == 0) {
        pWal->writeLock = '\x01';
        iVar10 = 0;
      }
    }
  }
  if ((iVar10 == 0) && (iVar10 = walIndexReadHdr(pWal,&local_144), local_144 != 0)) {
    psVar5 = pWal->pDbFd->pMethods;
    if (2 < psVar5->iVersion) {
      (*psVar5->xUnfetch)(pWal->pDbFd,0,(void *)0x0);
    }
  }
  if (iVar10 != 0) goto LAB_00126bf8;
  uVar18 = (pWal->hdr).mxFrame;
  if ((uVar18 == 0) || (uVar1 = (pWal->hdr).szPage, (CONCAT22(uVar1,uVar1) & 0x1fe00) == nBuf)) {
    uVar2 = (pWal->hdr).szPage;
    local_170 = *pWal->apWiData;
    if (local_170[0x18] < uVar18) {
      local_140 = (ulong)(uVar18 + 0x1000) + 0xffffffff021 >> 0xc;
      n = (u64)(int)((int)local_140 * 0x20 + uVar18 * 2 + 0x28);
      local_158 = xBusy;
      iVar10 = sqlite3_initialize();
      if (iVar10 == 0) {
        local_1b0 = (uint *)sqlite3Malloc(n);
      }
      else {
        local_1b0 = (uint *)0x0;
      }
      local_138 = (uint)uVar2;
      local_190 = pWal;
      local_128 = pBusyArg;
      if (local_1b0 == (uint *)0x0) {
        iVar10 = 7;
        local_1b0 = (uint *)0x0;
      }
      else {
        iVar10 = (int)local_140;
        memset(local_1b0,0,n);
        local_1b0[1] = iVar10 + 1;
        iVar10 = sqlite3_initialize();
        local_120 = (ulong)uVar18;
        if (iVar10 == 0) {
          uVar21 = 0x1000;
          if (uVar18 < 0x1000) {
            uVar21 = uVar18;
          }
          aTmp = (ht_slot *)sqlite3Malloc((ulong)(uVar21 * 2));
        }
        else {
          aTmp = (ht_slot *)0x0;
        }
        bVar24 = aTmp != (ht_slot *)0x0;
        local_168 = 7;
        if (bVar24) {
          local_168 = 0;
          if (-1 < (int)(uint)local_140) {
            local_130 = local_1b0 + 2;
            uVar22 = (ulong)((uint)local_140 & 0x7fffffff);
            uVar14 = 0;
            puVar17 = local_1b0;
            local_140 = uVar22;
            do {
              local_160 = uVar14;
              iVar10 = walIndexPage(local_190,(int)uVar14,&local_108);
              puVar9 = local_108;
              local_168 = CONCAT44(extraout_var,iVar10);
              bVar24 = iVar10 == 0;
              if (bVar24) {
                if (local_160 == 0) {
                  local_108 = local_108 + 0x22;
                  local_188 = (ulong)local_188._4_4_ << 0x20;
                }
                else {
                  local_188 = CONCAT44(local_188._4_4_,(int)local_160 * 0x1000 + -0x22);
                }
                local_118 = puVar9 + 0x1000;
                puVar17 = local_108 + -1;
              }
              if (iVar10 == 0) {
                puVar17 = puVar17 + 1;
                local_150 = (ulong)((long)local_118 - (long)puVar17) >> 2 & 0xffffffff;
                if (local_160 == uVar22) {
                  local_150 = (ulong)(uint)((int)local_120 - (int)local_188);
                }
                lVar23 = (long)local_130 +
                         (local_188 & 0xffffffff) * 2 + (long)(int)local_1b0[1] * 0x20;
                if ((int)local_150 < 1) {
                  local_194 = 0;
                  local_178 = (ht_slot *)0x0;
                  memset(&local_108,0,0xd0);
                  uVar18 = 1;
                }
                else {
                  uVar14 = 0;
                  do {
                    *(short *)(lVar23 + uVar14 * 2) = (short)uVar14;
                    uVar14 = uVar14 + 1;
                  } while (local_150 != uVar14);
                  local_194 = 0;
                  local_178 = (ht_slot *)0x0;
                  local_180 = local_150;
                  memset(&local_108,0,0xd0);
                  uVar14 = 0;
                  do {
                    local_194 = 1;
                    local_178 = (ht_slot *)(lVar23 + uVar14 * 2);
                    uVar22 = 0;
                    if ((uVar14 & 1) != 0) {
                      uVar22 = 0;
                      do {
                        walMerge(puVar17,*(ht_slot **)(local_100 + uVar22 * 4),
                                 local_100[(uVar22 * 2 + -1) * 2],&local_178,(int *)&local_194,aTmp)
                        ;
                        uVar18 = (int)uVar22 + 1;
                        uVar22 = (ulong)uVar18;
                      } while (((uint)uVar14 >> (uVar18 & 0x1f) & 1) != 0);
                    }
                    *(ht_slot **)(local_100 + uVar22 * 4) = local_178;
                    local_100[(uVar22 * 2 + -1) * 2] = local_194;
                    uVar14 = uVar14 + 1;
                  } while (uVar14 != local_180);
                  uVar18 = (int)uVar22 + 1;
                }
                if (uVar18 < 0xd) {
                  uVar22 = (ulong)uVar18;
                  puVar19 = local_100 + uVar22 * 4;
                  uVar14 = local_150;
                  do {
                    if (((uint)uVar14 >> ((uint)uVar22 & 0x1f) & 1) != 0) {
                      walMerge(puVar17,*(ht_slot **)puVar19,puVar19[-2],&local_178,(int *)&local_194
                               ,aTmp);
                      uVar14 = local_150;
                    }
                    uVar22 = uVar22 + 1;
                    puVar19 = puVar19 + 4;
                  } while ((int)uVar22 != 0xd);
                }
                uVar18 = (int)local_188 + 1;
                local_188 = CONCAT44(local_188._4_4_,uVar18);
                local_130[local_160 * 8 + 7] = uVar18;
                local_130[local_160 * 8 + 6] = local_194;
                *(long *)(local_130 + local_160 * 8 + 2) = lVar23;
                *(uint **)(local_130 + local_160 * 8 + 4) = puVar17;
                uVar22 = local_140;
              }
            } while (((int)local_168 == 0) && (uVar14 = local_160 + 1, local_160 < uVar22));
          }
        }
        sqlite3_free(aTmp);
        if (!bVar24) {
          sqlite3_free(local_1b0);
        }
        iVar10 = (int)local_168;
      }
      pWal = local_190;
      if (iVar10 != 0) goto LAB_00127364;
      local_1a8 = (local_190->hdr).mxFrame;
      local_150 = (ulong)(local_190->hdr).nPage;
      iVar10 = 0;
      lVar23 = 1;
      local_180 = CONCAT44(local_180._4_4_,local_138 << 0x10 | local_138) & 0xffffffff0001fe00;
      xBusy = local_158;
      do {
        pWVar8 = local_190;
        uVar18 = local_170[lVar23 + 0x19];
        if (uVar18 < local_1a8) {
          iVar7 = (int)lVar23 + 3;
          do {
            iVar10 = 0;
            if (pWVar8->exclusiveMode == '\0') {
              psVar6 = pWVar8->pDbFd;
              iVar10 = (*psVar6->pMethods->xShmLock)(psVar6,iVar7,1,10);
            }
          } while (((xBusy != (_func_int_void_ptr *)0x0) && (iVar10 == 5)) &&
                  (iVar12 = (*xBusy)(local_128), iVar12 != 0));
          if (iVar10 == 5) {
            iVar12 = 0;
            xBusy = (_func_int_void_ptr *)0x0;
            local_1a8 = uVar18;
            goto LAB_0012729e;
          }
          iVar12 = 5;
          if (iVar10 != 0) goto LAB_0012729e;
          uVar13 = 0xffffffff;
          if (lVar23 == 1) {
            uVar13 = local_1a8;
          }
          local_170[lVar23 + 0x19] = uVar13;
          iVar12 = 0;
          uVar18 = (uint)local_180;
          if (local_190->exclusiveMode == '\0') {
            (*local_190->pDbFd->pMethods->xShmLock)(local_190->pDbFd,iVar7,1,9);
          }
          iVar10 = 0;
        }
        else {
          iVar12 = 0;
LAB_0012729e:
          uVar18 = (uint)local_180;
        }
        pBusyArg = local_128;
        pWal = local_190;
        if (iVar12 != 0) {
          if (iVar12 != 5) goto LAB_00127364;
          goto LAB_0012735c;
        }
        lVar23 = lVar23 + 1;
      } while (lVar23 != 5);
      if (local_170[0x18] < local_1a8) {
        do {
          iVar10 = 0;
          if (pWal->exclusiveMode == '\0') {
            iVar10 = (*pWal->pDbFd->pMethods->xShmLock)(pWal->pDbFd,3,1,10);
          }
        } while (((xBusy != (_func_int_void_ptr *)0x0) && (iVar10 == 5)) &&
                (iVar12 = (*xBusy)(pBusyArg), iVar12 != 0));
        if (iVar10 == 0) {
          local_160 = CONCAT44(local_160._4_4_,local_170[0x18]);
          local_170[0x20] = local_1a8;
          if (sync_flags == 0) {
            iVar10 = 0;
          }
          else {
            iVar10 = (*pWal->pWalFd->pMethods->xSync)(pWal->pWalFd,sync_flags);
          }
          local_188 = (ulong)uVar18;
          if (iVar10 == 0) {
            local_178 = (ht_slot *)(local_150 * local_188);
            iVar10 = (*pWal->pDbFd->pMethods->xFileSize)(pWal->pDbFd,(sqlite3_int64 *)&local_108);
            if ((iVar10 == 0) && ((long)local_108 < (long)local_178)) {
              (*pWal->pDbFd->pMethods->xFileControl)(pWal->pDbFd,5,&local_178);
            }
            uVar18 = (uint)local_180;
          }
          local_168 = (ulong)(uVar18 | 0x18);
          uVar21 = 0;
          local_158 = xBusy;
          do {
            if (iVar10 != 0) break;
            if ((long)(int)local_1b0[1] < 1) {
              uVar16 = 0xffffffff;
            }
            else {
              uVar3 = *local_1b0;
              uVar16 = 0xffffffff;
              lVar23 = (long)(int)local_1b0[1];
              do {
                lVar15 = lVar23 + -1;
                puVar17 = local_1b0 + lVar15 * 8 + 2;
                uVar20 = local_1b0[lVar15 * 8 + 2];
                do {
                  if ((int)local_1b0[lVar15 * 8 + 8] <= (int)uVar20) break;
                  uVar2 = *(ushort *)(*(long *)(puVar17 + 2) + (long)(int)uVar20 * 2);
                  uVar4 = *(uint *)(*(long *)(puVar17 + 4) + (ulong)uVar2 * 4);
                  if (uVar3 < uVar4) {
                    if (uVar4 < uVar16) {
                      uVar21 = (uint)uVar2 + puVar17[7];
                      uVar16 = uVar4;
                    }
                  }
                  else {
                    uVar20 = uVar20 + 1;
                    *puVar17 = uVar20;
                  }
                } while (uVar4 <= uVar3);
                bVar24 = 1 < lVar23;
                lVar23 = lVar15;
              } while (bVar24);
            }
            *local_1b0 = uVar16;
            if (uVar16 == 0xffffffff) {
              iVar10 = 0;
              break;
            }
            if ((local_110->u1).isInterrupted == 0) {
              bVar24 = false;
              if (((uint)local_160 < uVar21) && (uVar21 <= local_1a8)) {
                iVar10 = 0;
                if (uVar16 <= (uint)local_150) {
                  iVar10 = (*local_190->pWalFd->pMethods->xRead)
                                     (local_190->pWalFd,zBuf,uVar18,(uVar21 - 1) * local_168 + 0x38)
                  ;
                  if (iVar10 != 0) goto LAB_001274e8;
                  iVar10 = (*local_190->pDbFd->pMethods->xWrite)
                                     (local_190->pDbFd,zBuf,uVar18,(uVar16 - 1) * local_188);
                  bVar24 = iVar10 != 0;
                }
              }
              else {
                iVar10 = 0;
              }
            }
            else {
              iVar10 = (uint)(local_110->mallocFailed == '\0') * 2 + 7;
LAB_001274e8:
              bVar24 = true;
            }
          } while (!bVar24);
          xBusy = local_158;
          pWal = local_190;
          if (iVar10 == 0) {
            iVar10 = 0;
            if (((local_1a8 == (*local_190->apWiData)[4]) &&
                (iVar10 = (*local_190->pDbFd->pMethods->xTruncate)
                                    (local_190->pDbFd,(local_190->hdr).nPage * local_188),
                sync_flags != 0)) && (iVar10 == 0)) {
              iVar10 = (*pWal->pDbFd->pMethods->xSync)(pWal->pDbFd,sync_flags);
            }
            if (iVar10 == 0) {
              local_170[0x18] = local_1a8;
              iVar10 = 0;
            }
          }
          if (pWal->exclusiveMode == '\0') {
            (*pWal->pDbFd->pMethods->xShmLock)(pWal->pDbFd,3,1,9);
          }
        }
      }
      if (iVar10 == 5) {
        iVar10 = 0;
      }
    }
    else {
      local_1b0 = (uint *)0x0;
      iVar10 = 0;
    }
    if (((iVar11 != 0) && (iVar10 == 0)) &&
       ((iVar10 = 5, (pWal->hdr).mxFrame <= local_170[0x18] && (iVar10 = 0, 1 < iVar11)))) {
      sqlite3_randomness(4,&local_108);
      do {
        iVar10 = 0;
        if (pWal->exclusiveMode == '\0') {
          iVar10 = (*pWal->pDbFd->pMethods->xShmLock)(pWal->pDbFd,4,4,10);
        }
      } while (((xBusy != (_func_int_void_ptr *)0x0) && (iVar10 == 5)) &&
              (iVar12 = (*xBusy)(pBusyArg), iVar12 != 0));
      if (iVar10 == 0) {
        iVar10 = 0;
        if (iVar11 == 3) {
          walRestartHdr(pWal,(u32)local_108);
          iVar10 = (*pWal->pWalFd->pMethods->xTruncate)(pWal->pWalFd,0);
        }
        if (pWal->exclusiveMode == '\0') {
          (*pWal->pDbFd->pMethods->xShmLock)(pWal->pDbFd,4,4,9);
        }
      }
    }
LAB_0012735c:
    sqlite3_free(local_1b0);
  }
  else {
    iVar10 = 0xb;
    sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0xe13b,
                "ada05cfa86ad7f5645450ac7a2a21c9aa6e57d2c");
    pWal = pWal;
  }
LAB_00127364:
  if ((iVar10 == 5) || (iVar10 == 0)) {
    if (pnLog != (int *)0x0) {
      *pnLog = (pWal->hdr).mxFrame;
    }
    if (pnCkpt != (int *)0x0) {
      *pnCkpt = (*pWal->apWiData)[0x18];
    }
  }
LAB_00126bf8:
  if (local_144 != 0) {
    (pWal->hdr).aSalt[0] = 0;
    (pWal->hdr).aSalt[1] = 0;
    (pWal->hdr).aCksum[0] = 0;
    (pWal->hdr).aCksum[1] = 0;
    (pWal->hdr).mxFrame = 0;
    (pWal->hdr).nPage = 0;
    (pWal->hdr).aFrameCksum[0] = 0;
    (pWal->hdr).aFrameCksum[1] = 0;
    (pWal->hdr).iVersion = 0;
    (pWal->hdr).unused = 0;
    (pWal->hdr).iChange = 0;
    (pWal->hdr).isInit = '\0';
    (pWal->hdr).bigEndCksum = '\0';
    (pWal->hdr).szPage = 0;
  }
  sqlite3WalEndWriteTransaction(pWal);
  if (pWal->exclusiveMode == '\0') {
    (*pWal->pDbFd->pMethods->xShmLock)(pWal->pDbFd,1,1,9);
  }
  iVar12 = 5;
  if (iVar10 != 0) {
    iVar12 = iVar10;
  }
  pWal->ckptLock = '\0';
  if (iVar11 == local_134) {
    iVar12 = iVar10;
  }
  return iVar12;
}

Assistant:

SQLITE_PRIVATE int sqlite3WalCheckpoint(
  Wal *pWal,                      /* Wal connection */
  sqlite3 *db,                    /* Check this handle's interrupt flag */
  int eMode,                      /* PASSIVE, FULL, RESTART, or TRUNCATE */
  int (*xBusy)(void*),            /* Function to call when busy */
  void *pBusyArg,                 /* Context argument for xBusyHandler */
  int sync_flags,                 /* Flags to sync db file with (or 0) */
  int nBuf,                       /* Size of temporary buffer */
  u8 *zBuf,                       /* Temporary buffer to use */
  int *pnLog,                     /* OUT: Number of frames in WAL */
  int *pnCkpt                     /* OUT: Number of backfilled frames in WAL */
){
  int rc;                         /* Return code */
  int isChanged = 0;              /* True if a new wal-index header is loaded */
  int eMode2 = eMode;             /* Mode to pass to walCheckpoint() */
  int (*xBusy2)(void*) = xBusy;   /* Busy handler for eMode2 */

  assert( pWal->ckptLock==0 );
  assert( pWal->writeLock==0 );

  /* EVIDENCE-OF: R-62920-47450 The busy-handler callback is never invoked
  ** in the SQLITE_CHECKPOINT_PASSIVE mode. */
  assert( eMode!=SQLITE_CHECKPOINT_PASSIVE || xBusy==0 );

  if( pWal->readOnly ) return SQLITE_READONLY;
  WALTRACE(("WAL%p: checkpoint begins\n", pWal));

  /* IMPLEMENTATION-OF: R-62028-47212 All calls obtain an exclusive 
  ** "checkpoint" lock on the database file. */
  rc = walLockExclusive(pWal, WAL_CKPT_LOCK, 1);
  if( rc ){
    /* EVIDENCE-OF: R-10421-19736 If any other process is running a
    ** checkpoint operation at the same time, the lock cannot be obtained and
    ** SQLITE_BUSY is returned.
    ** EVIDENCE-OF: R-53820-33897 Even if there is a busy-handler configured,
    ** it will not be invoked in this case.
    */
    testcase( rc==SQLITE_BUSY );
    testcase( xBusy!=0 );
    return rc;
  }
  pWal->ckptLock = 1;

  /* IMPLEMENTATION-OF: R-59782-36818 The SQLITE_CHECKPOINT_FULL, RESTART and
  ** TRUNCATE modes also obtain the exclusive "writer" lock on the database
  ** file.
  **
  ** EVIDENCE-OF: R-60642-04082 If the writer lock cannot be obtained
  ** immediately, and a busy-handler is configured, it is invoked and the
  ** writer lock retried until either the busy-handler returns 0 or the
  ** lock is successfully obtained.
  */
  if( eMode!=SQLITE_CHECKPOINT_PASSIVE ){
    rc = walBusyLock(pWal, xBusy, pBusyArg, WAL_WRITE_LOCK, 1);
    if( rc==SQLITE_OK ){
      pWal->writeLock = 1;
    }else if( rc==SQLITE_BUSY ){
      eMode2 = SQLITE_CHECKPOINT_PASSIVE;
      xBusy2 = 0;
      rc = SQLITE_OK;
    }
  }

  /* Read the wal-index header. */
  if( rc==SQLITE_OK ){
    rc = walIndexReadHdr(pWal, &isChanged);
    if( isChanged && pWal->pDbFd->pMethods->iVersion>=3 ){
      sqlite3OsUnfetch(pWal->pDbFd, 0, 0);
    }
  }

  /* Copy data from the log to the database file. */
  if( rc==SQLITE_OK ){

    if( pWal->hdr.mxFrame && walPagesize(pWal)!=nBuf ){
      rc = SQLITE_CORRUPT_BKPT;
    }else{
      rc = walCheckpoint(pWal, db, eMode2, xBusy2, pBusyArg, sync_flags, zBuf);
    }

    /* If no error occurred, set the output variables. */
    if( rc==SQLITE_OK || rc==SQLITE_BUSY ){
      if( pnLog ) *pnLog = (int)pWal->hdr.mxFrame;
      if( pnCkpt ) *pnCkpt = (int)(walCkptInfo(pWal)->nBackfill);
    }
  }

  if( isChanged ){
    /* If a new wal-index header was loaded before the checkpoint was 
    ** performed, then the pager-cache associated with pWal is now
    ** out of date. So zero the cached wal-index header to ensure that
    ** next time the pager opens a snapshot on this database it knows that
    ** the cache needs to be reset.
    */
    memset(&pWal->hdr, 0, sizeof(WalIndexHdr));
  }

  /* Release the locks. */
  sqlite3WalEndWriteTransaction(pWal);
  walUnlockExclusive(pWal, WAL_CKPT_LOCK, 1);
  pWal->ckptLock = 0;
  WALTRACE(("WAL%p: checkpoint %s\n", pWal, rc ? "failed" : "ok"));
  return (rc==SQLITE_OK && eMode!=eMode2 ? SQLITE_BUSY : rc);
}